

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_0::TextureCase::iterate(TextureCase *this)

{
  ostringstream *this_00;
  RenderContext *context;
  short sVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  deUint32 err;
  pointer puVar7;
  undefined4 extraout_var;
  short sVar8;
  char *description;
  int y;
  long lVar9;
  int x_1;
  qpTestResult testResult;
  pointer puVar10;
  unsigned_short uVar11;
  unsigned_short uVar12;
  int x;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float posX;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  Surface resultImage;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> gridTexCoords;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridVertices;
  MessageBuilder local_1b0;
  
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&gridVertices,0x100,(allocator_type *)&local_1b0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&gridTexCoords,0x100,(allocator_type *)&local_1b0);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&indices,0x546,(allocator_type *)&local_1b0);
  tcu::Surface::Surface(&resultImage,0x100,0x100);
  lVar15 = 8;
  lVar16 = 4;
  for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
    fVar20 = (float)(int)lVar13 / 15.0;
    lVar14 = lVar15;
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      fVar17 = (float)(int)lVar9 / 15.0;
      fVar18 = exp2f((float)(int)lVar13 + -8.0);
      fVar19 = exp2f((float)(int)lVar9 + -8.0);
      *(float *)((long)(gridVertices.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14 + -8) =
           fVar20 + fVar20 + -1.0;
      *(float *)((long)(gridVertices.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14 + -4) =
           fVar17 + fVar17 + -1.0;
      *(undefined8 *)
       ((long)(gridVertices.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_data + lVar14) = 0x3f80000000000000;
      *(float *)((long)gridTexCoords.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar9].m_data + lVar16 + -4) =
           fVar18;
      *(float *)((long)gridTexCoords.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar9].m_data + lVar16) = fVar19;
      lVar14 = lVar14 + 0x10;
    }
    lVar15 = lVar15 + 0x100;
    lVar16 = lVar16 + 0x80;
  }
  puVar7 = indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start + 5;
  sVar8 = 0;
  for (lVar15 = 0; puVar10 = puVar7, lVar16 = -0xf, lVar15 != 0xf; lVar15 = lVar15 + 1) {
    for (; lVar16 != 0; lVar16 = lVar16 + 1) {
      sVar1 = (short)lVar16;
      uVar11 = sVar8 + sVar1 + 0xf;
      puVar10[-5] = uVar11;
      uVar12 = sVar8 + 0x20 + sVar1;
      puVar10[-4] = uVar12;
      puVar10[-3] = sVar8 + 0x1f + sVar1;
      puVar10[-2] = uVar11;
      puVar10[-1] = uVar12;
      *puVar10 = sVar8 + sVar1 + 0x10;
      puVar10 = puVar10 + 6;
    }
    sVar8 = sVar8 + 0x10;
    puVar7 = puVar7 + 0x5a;
  }
  local_1b0.m_log =
       ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Drawing a textured grid with the shader.");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  iVar3 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  lVar15 = CONCAT44(extraout_var,iVar3);
  uVar4 = (**(code **)(lVar15 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_pos");
  uVar5 = (**(code **)(lVar15 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_attr");
  uVar6 = (**(code **)(lVar15 + 0xb48))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"u_sampler");
  (**(code **)(lVar15 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar15 + 0x188))(0x4000);
  (**(code **)(lVar15 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar15 + 0x1680))((((this->super_RenderCase).m_program)->m_program).m_program);
  (**(code **)(lVar15 + 0x14f0))(uVar6,0);
  (**(code **)(lVar15 + 0xb8))(0xde1,this->m_textureID);
  (**(code **)(lVar15 + 0x19f0))
            (uVar4,4,0x1406,0,0,
             gridVertices.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (**(code **)(lVar15 + 0x19f0))
            (uVar5,2,0x1406,0,0,
             gridTexCoords.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (**(code **)(lVar15 + 0x610))(uVar4);
  (**(code **)(lVar15 + 0x610))(uVar5);
  (**(code **)(lVar15 + 0x568))
            (4,(ulong)((long)indices.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)indices.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 1,0x1403);
  (**(code **)(lVar15 + 0x518))(uVar4);
  (**(code **)(lVar15 + 0x518))(uVar5);
  (**(code **)(lVar15 + 0x1680))(0);
  (**(code **)(lVar15 + 0x648))();
  err = (**(code **)(lVar15 + 0x800))();
  glu::checkError(err,"TextureCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x4cc);
  context = ((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&resultImage);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&local_1b0);
  bVar2 = RenderCase::checkResultImage(&this->super_RenderCase,&resultImage);
  if (bVar2) {
    bVar2 = RenderCase::drawTestPattern(&this->super_RenderCase,true);
    testResult = (qpTestResult)!bVar2;
    description = "test pattern failed";
    if (bVar2) {
      description = "Pass";
    }
  }
  else {
    description = "missing or invalid fragments";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             testResult,description);
  tcu::Surface::~Surface(&resultImage);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&gridTexCoords.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&gridVertices.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return STOP;
}

Assistant:

TextureCase::IterateResult TextureCase::iterate (void)
{
	// Draw a grid and texture it with a floating point texture containing special values. If all goes well, nothing special should happen

	const int				gridSize		= 16;
	std::vector<tcu::Vec4>	gridVertices	(gridSize * gridSize);
	std::vector<tcu::Vec2>	gridTexCoords	(gridSize * gridSize);
	std::vector<deUint16>	indices			((gridSize - 1) * (gridSize - 1) * 6);
	tcu::Surface			resultImage		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < gridSize; ++x)
	for (int y = 0; y < gridSize; ++y)
	{
		const float posX		= (float)x / ((float)gridSize - 1.0f) * 2.0f - 1.0f; // map from [0, gridSize - 1] to [-1, 1]
		const float posY		= (float)y / ((float)gridSize - 1.0f) * 2.0f - 1.0f;
		const float texCoordX	= deFloatPow(2.0f, (float)x - (float)gridSize / 2.0f);
		const float texCoordY	= deFloatPow(2.0f, (float)y - (float)gridSize / 2.0f);

		gridVertices[x * gridSize + y]	= tcu::Vec4(posX, posY, 0.0f, 1.0f);
		gridTexCoords[x * gridSize + y]	= tcu::Vec2(texCoordX, texCoordY);
	}

	// tiles
	for (int x = 0; x < gridSize - 1; ++x)
	for (int y = 0; y < gridSize - 1; ++y)
	{
		const int baseNdx = (x * (gridSize - 1) + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * gridSize + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * gridSize + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * gridSize + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * gridSize + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * gridSize + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * gridSize + (y+1));
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a textured grid with the shader." << tcu::TestLog::EndMessage;

	// Draw grid
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				texCoordLoc	= gl.getAttribLocation(m_program->getProgram(), "a_attr");
		const GLint				samplerLoc	= gl.getUniformLocation(m_program->getProgram(), "u_sampler");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());

		gl.uniform1i(samplerLoc, 0);
		gl.bindTexture(GL_TEXTURE_2D, m_textureID);

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.vertexAttribPointer(texCoordLoc, 2, GL_FLOAT, GL_FALSE, 0, &gridTexCoords[0]);

		gl.enableVertexAttribArray(positionLoc);
		gl.enableVertexAttribArray(texCoordLoc);
		gl.drawElements(GL_TRIANGLES, (glw::GLsizei)(indices.size()), GL_UNSIGNED_SHORT, &indices[0]);
		gl.disableVertexAttribArray(positionLoc);
		gl.disableVertexAttribArray(texCoordLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "TextureCase::iterate");

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify everywhere was drawn (all pixels have Green = 255)
	if (!checkResultImage(resultImage))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing or invalid fragments");
		return STOP;
	}

	// test drawing and textures still works
	if (!drawTestPattern(true))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "test pattern failed");
		return STOP;
	}

	// all ok
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}